

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalKdevelopGenerator::CreateProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *projectname,
          string *executable,string *cmakeFilePattern,string *fileToOpen)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  uint uVar6;
  unsigned_long dindex;
  string sessionFilename;
  Directory d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string filename;
  string tmp;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->Blacklist,
                    (this->Blacklist).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar1 = (outputDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar1,pcVar1 + outputDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  sessionFilename._M_dataplus._M_p = (pointer)&sessionFilename.field_2;
  pcVar1 = (projectname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sessionFilename,pcVar1,pcVar1 + projectname->_M_string_length);
  std::__cxx11::string::append((char *)&sessionFilename);
  std::__cxx11::string::_M_append((char *)&filename,(ulong)sessionFilename._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionFilename._M_dataplus._M_p != &sessionFilename.field_2) {
    operator_delete(sessionFilename._M_dataplus._M_p,
                    sessionFilename.field_2._M_allocated_capacity + 1);
  }
  sessionFilename._M_dataplus._M_p = (pointer)&sessionFilename.field_2;
  pcVar1 = (outputDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sessionFilename,pcVar1,pcVar1 + outputDir->_M_string_length);
  std::__cxx11::string::append((char *)&sessionFilename);
  __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
  pcVar1 = (projectname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str_2,pcVar1,pcVar1 + projectname->_M_string_length);
  std::__cxx11::string::append((char *)&__str_2);
  std::__cxx11::string::_M_append((char *)&sessionFilename,(ulong)__str_2._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
    operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmsys::SystemTools::FileExists(filename._M_dataplus._M_p);
  if (bVar2) {
    MergeProjectFiles(this,outputDir,projectDir,&filename,executable,cmakeFilePattern,fileToOpen,
                      &sessionFilename);
  }
  else {
    cmsys::Directory::Directory(&d);
    bVar2 = cmsys::Directory::Load(&d,projectDir);
    if (bVar2) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&d);
      if (uVar4 != 0) {
        uVar6 = 1;
        dindex = 0;
        do {
          pcVar5 = cmsys::Directory::GetFile(&d,dindex);
          std::__cxx11::string::string((string *)&__str_2,pcVar5,(allocator *)&tmp);
          iVar3 = std::__cxx11::string::compare((char *)&__str_2);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&__str_2);
            if (iVar3 != 0) {
              tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
              pcVar1 = (projectDir->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&tmp,pcVar1,pcVar1 + projectDir->_M_string_length);
              std::__cxx11::string::append((char *)&tmp);
              std::__cxx11::string::_M_append((char *)&tmp,(ulong)__str_2._M_dataplus._M_p);
              bVar2 = cmsys::SystemTools::FileIsDirectory(&tmp);
              if (bVar2) {
                std::__cxx11::string::append((char *)&tmp);
                iVar3 = std::__cxx11::string::compare((char *)&__str_2);
                if (iVar3 != 0) {
                  bVar2 = cmsys::SystemTools::FileExists(tmp._M_dataplus._M_p);
                  if (!bVar2) goto LAB_002f9e8b;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->Blacklist,&__str_2);
              }
LAB_002f9e8b:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tmp._M_dataplus._M_p != &tmp.field_2) {
                operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
          }
          dindex = (unsigned_long)uVar6;
          uVar6 = uVar6 + 1;
        } while (dindex < uVar4);
      }
    }
    CreateNewProjectFile
              (this,outputDir,projectDir,&filename,executable,cmakeFilePattern,fileToOpen,
               &sessionFilename);
    cmsys::Directory::~Directory(&d);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionFilename._M_dataplus._M_p != &sessionFilename.field_2) {
    operator_delete(sessionFilename._M_dataplus._M_p,
                    sessionFilename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& projectname, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen)
{
  this->Blacklist.clear();

  std::string filename = outputDir + "/";
  filename += projectname + ".kdevelop";
  std::string sessionFilename = outputDir + "/";
  sessionFilename += projectname + ".kdevses";

  if (cmSystemTools::FileExists(filename.c_str())) {
    this->MergeProjectFiles(outputDir, projectDir, filename, executable,
                            cmakeFilePattern, fileToOpen, sessionFilename);
  } else {
    // add all subdirectories which are cmake build directories to the
    // kdevelop blacklist so they are not monitored for added or removed files
    // since this is handled by adding files to the cmake files
    cmsys::Directory d;
    if (d.Load(projectDir)) {
      size_t numf = d.GetNumberOfFiles();
      for (unsigned int i = 0; i < numf; i++) {
        std::string nextFile = d.GetFile(i);
        if ((nextFile != ".") && (nextFile != "..")) {
          std::string tmp = projectDir;
          tmp += "/";
          tmp += nextFile;
          if (cmSystemTools::FileIsDirectory(tmp)) {
            tmp += "/CMakeCache.txt";
            if ((nextFile == "CMakeFiles") ||
                (cmSystemTools::FileExists(tmp.c_str()))) {
              this->Blacklist.push_back(nextFile);
            }
          }
        }
      }
    }
    this->CreateNewProjectFile(outputDir, projectDir, filename, executable,
                               cmakeFilePattern, fileToOpen, sessionFilename);
  }
}